

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O2

void __thiscall
duckdb::DictionaryDecoder::ConvertDictToSelVec
          (DictionaryDecoder *this,uint32_t *offsets,SelectionVector *rows,idx_t count)

{
  sel_t *psVar1;
  sel_t *psVar2;
  ulong uVar3;
  runtime_error *this_00;
  idx_t iVar4;
  idx_t iVar5;
  
  psVar1 = rows->sel_vector;
  psVar2 = (this->dictionary_selection_vector).sel_vector;
  uVar3 = this->dictionary_size;
  iVar4 = 0;
  while( true ) {
    if (count == iVar4) {
      return;
    }
    iVar5 = iVar4;
    if (psVar1 != (sel_t *)0x0) {
      iVar5 = (idx_t)psVar1[iVar4];
    }
    if (uVar3 <= offsets[iVar4]) break;
    psVar2[iVar5] = offsets[iVar4];
    iVar4 = iVar4 + 1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error
            (this_00,"Parquet file is likely corrupted, dictionary offset out of range");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DictionaryDecoder::ConvertDictToSelVec(uint32_t *offsets, const SelectionVector &rows, idx_t count) {
	D_ASSERT(count <= STANDARD_VECTOR_SIZE);
	for (idx_t idx = 0; idx < count; idx++) {
		auto row_idx = rows.get_index(idx);
		auto offset = offsets[idx];
		if (offset >= dictionary_size) {
			throw std::runtime_error("Parquet file is likely corrupted, dictionary offset out of range");
		}
		dictionary_selection_vector.set_index(row_idx, offset);
	}
}